

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::t_formatter<spdlog::details::null_scoped_padder>::format
          (t_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  null_scoped_padder local_2d;
  uint local_2c;
  null_scoped_padder p;
  memory_buf_t *pmStack_28;
  uint field_size;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  t_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  pmStack_28 = dest;
  local_2c = null_scoped_padder::count_digits<unsigned_long>(msg->thread_id);
  null_scoped_padder::null_scoped_padder
            (&local_2d,(ulong)local_2c,&(this->super_flag_formatter).padinfo_,pmStack_28);
  fmt_helper::append_int<unsigned_long>(msg->thread_id,pmStack_28);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }